

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acquisition.c
# Opt level: O1

int katherine_acquisition_init
              (katherine_acquisition_t *acq,katherine_device_t *device,void *ctx,
              size_t md_buffer_size,size_t pixel_buffer_size,int report_timeout,int fail_timeout)

{
  char *__ptr;
  char *pcVar1;
  int iVar2;
  
  acq->device = device;
  acq->user_ctx = ctx;
  acq->state = '\0';
  acq->aborted = false;
  acq->md_buffer_size = md_buffer_size;
  __ptr = (char *)malloc(md_buffer_size + 7 & 0xfffffffffffffff8);
  acq->md_buffer = __ptr;
  iVar2 = 0xc;
  if (__ptr != (char *)0x0) {
    acq->pixel_buffer_size = pixel_buffer_size;
    pcVar1 = (char *)malloc(pixel_buffer_size);
    acq->pixel_buffer = pcVar1;
    acq->pixel_buffer_valid = 0;
    if (pcVar1 == (char *)0x0) {
      free(__ptr);
    }
    else {
      acq->report_timeout = report_timeout;
      acq->fail_timeout = fail_timeout;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
katherine_acquisition_init(katherine_acquisition_t *acq, katherine_device_t *device, void *ctx, size_t md_buffer_size, size_t pixel_buffer_size, int report_timeout, int fail_timeout)
{
    int res = 0;

    acq->device = device;
    acq->user_ctx = ctx;
    acq->state = ACQUISITION_NOT_STARTED;
    acq->aborted = false;

    acq->md_buffer_size = md_buffer_size;

    // Round MD buffer size up to the nearest multiple of 8 bytes.
    // This is just a safety precaution due to accessing 6-byte MD's as uint64_t's.
    size_t actual_md_buffer_size = ((acq->md_buffer_size + 7) / 8) * 8;
    acq->md_buffer = (char *) malloc(actual_md_buffer_size);
    if (acq->md_buffer == NULL) {
        res = ENOMEM;
        goto err_datagram_buffer;
    }

    acq->pixel_buffer_size = pixel_buffer_size;
    acq->pixel_buffer = (char *) malloc(acq->pixel_buffer_size);
    acq->pixel_buffer_valid = 0;
    if (acq->pixel_buffer == NULL) {
        res = ENOMEM;
        goto err_pixel_buffer;
    }

    acq->report_timeout = report_timeout;
    acq->fail_timeout = fail_timeout;

    return res;

err_pixel_buffer:
    free(acq->md_buffer);
err_datagram_buffer:
    return res;
}